

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

char * ImGui::TableGetColumnName(int column_n)

{
  ImGuiTable *pIVar1;
  char *pcVar2;
  long lVar3;
  
  pIVar1 = GImGui->CurrentTable;
  if (pIVar1 != (ImGuiTable *)0x0) {
    if (column_n < 0) {
      column_n = pIVar1->CurrentColumn;
    }
    pcVar2 = "";
    if (((pIVar1->IsLayoutLocked != false) || (column_n < pIVar1->DeclColumnsCount)) &&
       (lVar3 = (long)(pIVar1->Columns).Data[column_n].NameOffset, lVar3 != -1)) {
      pcVar2 = (pIVar1->ColumnsNames).Buf.Data + lVar3;
    }
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

const char* ImGui::TableGetColumnName(int column_n)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    if (!table)
        return NULL;
    if (column_n < 0)
        column_n = table->CurrentColumn;
    return TableGetColumnName(table, column_n);
}